

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::CanStore
          (BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *this,
          idx_t data_bytes,idx_t meta_bytes)

{
  CompressionInfo *this_00;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  idx_t iVar4;
  
  this_00 = &(this->super_CompressionState).info;
  iVar3 = CompressionInfo::GetBlockSize(this_00);
  pdVar1 = this->metadata_ptr;
  pdVar2 = this->data_ptr;
  iVar4 = CompressionInfo::GetBlockSize(this_00);
  return pdVar2 + (((data_bytes + 7 & 0xfffffffffffffff8) + meta_bytes + iVar3) - (long)pdVar1) <=
         (data_ptr_t)(iVar4 - 8);
}

Assistant:

bool CanStore(idx_t data_bytes, idx_t meta_bytes) {
		auto required_data_bytes = AlignValue<idx_t>(UnsafeNumericCast<idx_t>((data_ptr + data_bytes) - data_ptr));
		auto required_meta_bytes = info.GetBlockSize() - UnsafeNumericCast<idx_t>(metadata_ptr - data_ptr) + meta_bytes;

		return required_data_bytes + required_meta_bytes <=
		       info.GetBlockSize() - BitpackingPrimitives::BITPACKING_HEADER_SIZE;
	}